

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O2

void __thiscall
asio::detail::posix_event::
unlock_and_signal_one<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  
  if (lock->locked_ == false) {
    __assert_fail("lock.locked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/detail/posix_event.hpp"
                  ,0x42,
                  "void asio::detail::posix_event::unlock_and_signal_one(Lock &) [Lock = asio::detail::conditionally_enabled_mutex::scoped_lock]"
                 );
  }
  uVar1 = this->state_;
  this->state_ = uVar1 | 1;
  conditionally_enabled_mutex::scoped_lock::unlock(lock);
  if (1 < uVar1) {
    pthread_cond_signal((pthread_cond_t *)this);
    return;
  }
  return;
}

Assistant:

void unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    bool have_waiters = (state_ > 1);
    lock.unlock();
    if (have_waiters)
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
  }